

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O2

Var Js::RegexHelper::RegexEs5SplitImpl
              (ScriptContext *scriptContext,JavascriptRegExp *regularExpression,
              JavascriptString *input,CharCount limit,bool noResult,void *stackAllocationPointer)

{
  RecyclableObject *nonMatchValue;
  code *pcVar1;
  bool bVar2;
  uint16 uVar3;
  charcount_t inputLength;
  CharCount offset;
  JavascriptArray *this;
  RegexPattern *this_00;
  char16 *input_00;
  GroupInfo GVar4;
  Var newValue;
  undefined4 *puVar5;
  ulong uVar6;
  RegexPattern *extraout_RDX;
  RegexPattern *pattern;
  RegexPattern *extraout_RDX_00;
  RegexPattern *extraout_RDX_01;
  RegexPattern *extraout_RDX_02;
  RegexPattern *extraout_RDX_03;
  RegexPattern *extraout_RDX_04;
  RegexPattern *extraout_RDX_05;
  CharCount CVar7;
  undefined7 in_register_00000081;
  int groupId;
  uint uVar8;
  undefined1 local_98 [8];
  RegexMatchState state;
  GroupInfo match;
  GroupInfo local_48;
  ulong local_40;
  
  CVar7 = (CharCount)CONCAT71(in_register_00000081,noResult);
  if ((CVar7 == 0) || (((scriptContext->config).threadConfig)->m_SkipSplitOnNoResult != true)) {
    RegexHelperTrace(scriptContext,Split,regularExpression,input);
    this = JavascriptLibrary::CreateArrayOnStack
                     ((scriptContext->super_ScriptContextBase).javascriptLibrary,
                      stackAllocationPointer);
    if (limit != 0) {
      this_00 = GetSplitPattern(scriptContext,regularExpression);
      input_00 = JavascriptString::GetString(input);
      inputLength = JavascriptString::GetLength(input);
      uVar3 = UnifiedRegex::RegexPattern::NumGroups(this_00);
      nonMatchValue =
           (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
           super_JavascriptLibraryBase).undefinedValue.ptr;
      local_48.offset = 0;
      local_48.length = 0;
      PrimBeginMatch((RegexMatchState *)local_98,scriptContext,this_00,input_00,CVar7,false);
      if (inputLength == 0) {
        local_48.offset = 0;
        local_48.length = 0;
        GVar4 = PrimMatch((RegexMatchState *)local_98,scriptContext,this_00,0,0);
        if ((ulong)GVar4 < 0xffffffff00000000) {
          local_40 = (ulong)GVar4 >> 0x20;
          pattern = extraout_RDX_03;
          local_48 = GVar4;
        }
        else {
          JavascriptArray::DirectAppendItem(this,input);
          local_40 = 0xffffffffffffffff;
          pattern = extraout_RDX_04;
        }
      }
      else {
        local_40 = 0xffffffffffffffff;
        offset = 0;
        pattern = extraout_RDX;
        CVar7 = 0;
LAB_00be070a:
        if (offset < inputLength) {
          GVar4 = PrimMatch((RegexMatchState *)local_98,scriptContext,this_00,inputLength,offset);
          uVar6 = (ulong)GVar4 >> 0x20;
          pattern = (RegexPattern *)0xffffffff;
          state.matcher = (Matcher *)GVar4;
          if ((uVar6 == 0xffffffff) ||
             (uVar8 = GVar4.offset, local_48 = GVar4, local_40 = uVar6, inputLength <= uVar8))
          goto LAB_00be0848;
          offset = UnifiedRegex::GroupInfo::EndOffset((GroupInfo *)&state.matcher);
          if (offset == CVar7) {
            offset = uVar8 + 1;
            pattern = extraout_RDX_00;
          }
          else {
            AppendSubString(scriptContext,this,input,CVar7,uVar8);
            pattern = extraout_RDX_01;
            if (limit <= (this->super_ArrayObject).length) goto LAB_00be0848;
            uVar8 = 1;
            do {
              CVar7 = offset;
              if (uVar3 <= uVar8) break;
              newValue = GetGroup(scriptContext,this_00,input,nonMatchValue,uVar8);
              JavascriptArray::DirectAppendItem(this,newValue);
              uVar8 = uVar8 + 1;
              pattern = extraout_RDX_02;
            } while ((this->super_ArrayObject).length < limit);
          }
          goto LAB_00be070a;
        }
LAB_00be0848:
        if ((this->super_ArrayObject).length < limit) {
          AppendSubString(scriptContext,this,input,CVar7,inputLength);
          pattern = extraout_RDX_05;
        }
      }
      PrimEndMatch((RegexMatchState *)local_98,scriptContext,pattern);
      bVar2 = UnifiedRegex::RegexPattern::IsSticky(this_00);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                    ,0x719,"(!splitPattern->IsSticky())","!splitPattern->IsSticky()"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
      bVar2 = UnifiedRegex::RegexPattern::IsGlobal(this_00);
      PropagateLastMatch(scriptContext,bVar2,false,regularExpression,input,
                         (GroupInfo)((ulong)local_48 & 0xffffffff | local_40 << 0x20),
                         (GroupInfo)0xffffffff00000000,true,true,true);
    }
  }
  else {
    this = (JavascriptArray *)
           (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
           super_JavascriptLibraryBase).nullValue.ptr;
  }
  return this;
}

Assistant:

Var RegexHelper::RegexEs5SplitImpl(ScriptContext* scriptContext, JavascriptRegExp* regularExpression, JavascriptString* input, CharCount limit, bool noResult, void *const stackAllocationPointer)
    {
        if (noResult && scriptContext->GetConfig()->SkipSplitOnNoResult())
        {
            // TODO: Fix this so that the side effect for PropagateLastMatch is done
            return scriptContext->GetLibrary()->GetNull();
        }

#if ENABLE_REGEX_CONFIG_OPTIONS
        RegexHelperTrace(scriptContext, UnifiedRegex::RegexStats::Split, regularExpression, input);
#endif

        JavascriptArray* ary = scriptContext->GetLibrary()->CreateArrayOnStack(stackAllocationPointer);

        if (limit == 0)
        {
            // SPECIAL CASE: Zero limit
            return ary;
        }

        UnifiedRegex::RegexPattern *splitPattern = GetSplitPattern(scriptContext, regularExpression);

        const char16* inputStr = input->GetString();
        CharCount inputLength = input->GetLength(); // s in spec
        const int numGroups = splitPattern->NumGroups();
        Var nonMatchValue = NonMatchValue(scriptContext, false);
        UnifiedRegex::GroupInfo lastSuccessfulMatch; // initially undefined

        RegexMatchState state;
        PrimBeginMatch(state, scriptContext, splitPattern, inputStr, inputLength, false);

        if (inputLength == 0)
        {
            // SPECIAL CASE: Empty string
            UnifiedRegex::GroupInfo match = PrimMatch(state, scriptContext, splitPattern, inputLength, 0);
            if (match.IsUndefined())
                ary->DirectAppendItem(input);
            else
                lastSuccessfulMatch = match;
        }
        else
        {
            CharCount copyOffset = 0;  // p in spec
            CharCount startOffset = 0; // q in spec

            CharCount inputLimit = inputLength;

            while (startOffset < inputLimit)
            {
                UnifiedRegex::GroupInfo match = PrimMatch(state, scriptContext, splitPattern, inputLength, startOffset);

                if (match.IsUndefined())
                    break;

                lastSuccessfulMatch = match;

                if (match.offset >= inputLimit)
                    break;

                startOffset = match.offset;
                CharCount endOffset = match.EndOffset(); // e in spec

                if (endOffset == copyOffset)
                    startOffset++;
                else
                {
                    AppendSubString(scriptContext, ary, input, copyOffset, startOffset);
                    if (ary->GetLength() >= limit)
                        break;

                    startOffset = copyOffset = endOffset;

                    for (int groupId = 1; groupId < numGroups; groupId++)
                    {
                        ary->DirectAppendItem(GetGroup(scriptContext, splitPattern, input, nonMatchValue, groupId));
                        if (ary->GetLength() >= limit)
                            break;
                    }
                }
            }

            if (ary->GetLength() < limit)
                AppendSubString(scriptContext, ary, input, copyOffset, inputLength);
        }

        PrimEndMatch(state, scriptContext, splitPattern);
        Assert(!splitPattern->IsSticky());
        PropagateLastMatch
            ( scriptContext
            , splitPattern->IsGlobal()
            , /* isSticky */ false
            , regularExpression
            , input
            , lastSuccessfulMatch
            , UnifiedRegex::GroupInfo()
            , /* updateRegex */ true
            , /* updateCtor */ true
            , /* useSplitPattern */ true );

        return ary;
    }